

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O1

bool __thiscall
NewEdgeCalculator::similarityCriterion
          (NewEdgeCalculator *this,AlignmentRecord *a1,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap1,
          AlignmentRecord *a2,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap2,
          double probM,double prob0,int tc,int cc)

{
  NewEdgeCalculator *pNVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  string local_d8;
  double local_b8;
  double local_b0;
  double local_a8;
  vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *local_a0;
  NewEdgeCalculator *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_b8 = prob0;
  local_a8 = probM;
  local_98 = this;
  AlignmentRecord::getName_abi_cxx11_(&local_d8,a1);
  bVar6 = false;
  lVar2 = std::__cxx11::string::find((char *)&local_d8,0x19981e,0);
  if (lVar2 != -1) {
    AlignmentRecord::getName_abi_cxx11_(&local_50,a2);
    lVar2 = std::__cxx11::string::find((char *)&local_50,0x19981e,0);
    bVar6 = lVar2 != -1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  local_a0 = cov_ap1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  lVar2 = 0x30;
  if (!bVar6) {
    AlignmentRecord::getName_abi_cxx11_(&local_d8,a1);
    lVar3 = std::__cxx11::string::find((char *)&local_d8,0x19981e,0);
    lVar2 = 0x20;
    if (lVar3 == -1) {
      AlignmentRecord::getName_abi_cxx11_(&local_70,a2);
      lVar2 = std::__cxx11::string::find((char *)&local_70,0x19981e,0);
      lVar2 = (ulong)(lVar2 == -1) * 8 + 0x20;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  pNVar1 = local_98;
  local_b0 = log10(*(double *)((long)&(local_98->super_EdgeCalculator)._vptr_EdgeCalculator + lVar2)
                  );
  AlignmentRecord::getName_abi_cxx11_(&local_d8,a1);
  lVar2 = std::__cxx11::string::find((char *)&local_d8,0x19981e,0);
  if (lVar2 == -1) {
    lVar2 = 0x10;
  }
  else {
    AlignmentRecord::getName_abi_cxx11_(&local_90,a2);
    lVar2 = std::__cxx11::string::find((char *)&local_90,0x19981e,0);
    lVar2 = (ulong)(lVar2 == -1) * 8 + 8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  dVar9 = (double)cc;
  uVar4 = ((long)(local_a0->
                 super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(local_a0->
                 super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uVar5 = ((long)(cov_ap2->
                 super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(cov_ap2->
                 super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar4 <= uVar5) {
    uVar5 = uVar4;
  }
  auVar8._8_4_ = (int)(uVar5 >> 0x20);
  auVar8._0_8_ = uVar5;
  auVar8._12_4_ = 0x45300000;
  if (dVar9 <= ((auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) *
               *(double *)((long)&(pNVar1->super_EdgeCalculator)._vptr_EdgeCalculator + lVar2)) {
    bVar6 = false;
  }
  else {
    bVar6 = pNVar1->NOPROB0;
    if (bVar6 == false) {
      dVar9 = (double)(cc + tc);
    }
    dVar7 = log10(local_a8);
    if (bVar6 == false) {
      dVar7 = dVar7 + local_b8;
    }
    bVar6 = local_b0 <= (1.0 / dVar9) * dVar7;
  }
  return bVar6;
}

Assistant:

bool NewEdgeCalculator::similarityCriterion(const AlignmentRecord & a1, const std::vector<AlignmentRecord::mapValue> &cov_ap1, const AlignmentRecord & a2, const std::vector<AlignmentRecord::mapValue> &cov_ap2, double probM, double prob0, int tc, int cc) const{

    //Threshold for probability that reads were sampled from same haplotype
    double cutoff = 0;
    if (a1.getName().find("Clique") != string::npos && a2.getName().find("Clique") != string::npos) {
        cutoff = std::log10(this->EDGE_QUASI_CUTOFF);
    } else if (a1.getName().find("Clique") != string::npos || a2.getName().find("Clique") != string::npos) {
        cutoff = std::log10(this->EDGE_QUASI_CUTOFF_MIXED);
    } else {
        cutoff = std::log10(this->EDGE_QUASI_CUTOFF_SINGLE);
    }

    //Threshold for Overlap of Read Alignments
    double MIN_OVERLAP = 0;
    if (a1.getName().find("Clique") != string::npos && a2.getName().find("Clique") != string::npos) {
        MIN_OVERLAP = MIN_OVERLAP_CLIQUES;
    } else {
        MIN_OVERLAP = MIN_OVERLAP_SINGLE;
    }
    //double ratio = (float)cc/tc;
    if (cc<=MIN_OVERLAP*std::min(cov_ap1.size(),cov_ap2.size())) return false;
    double prob;
    double potence;
    /*if((double)cc/tc<=0.15 && probM >= 0.8 && MIN_OVERLAP==0.1){
        prob = probM;
        potence = 1.0/(cc);
    } else {*/
    //TEST to see what happens if prob0 is neglected
    if(this->NOPROB0){
        prob = std::log10(probM);
        potence = 1.0/cc;
    } else {
        prob = std::log10(probM) + prob0;
        potence = 1.0/(cc+tc);
    }
    //}
    double final_prob = prob*potence;
    //cout << "Final prob: " << final_prob << endl;
    return final_prob >= cutoff;
}